

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

void __thiscall
CVmObjList::restore_from_file(CVmObjList *this,vm_obj_id_t param_1,CVmFile *fp,CVmObjFixup *fixups)

{
  uint16_t tmp;
  ulong cnt;
  char b [2];
  ushort local_2a;
  
  CVmFile::read_bytes(fp,(char *)&local_2a,2);
  cnt = (ulong)local_2a;
  if ((this->super_CVmObjCollection).super_CVmObject.ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
    (this->super_CVmObjCollection).super_CVmObject.ext_ = (char *)0x0;
  }
  alloc_list(this,cnt);
  *(ushort *)(this->super_CVmObjCollection).super_CVmObject.ext_ = local_2a;
  CVmFile::read_bytes(fp,(this->super_CVmObjCollection).super_CVmObject.ext_ + 2,cnt * 5);
  CVmObjFixup::fix_dh_array(fixups,(this->super_CVmObjCollection).super_CVmObject.ext_ + 2,cnt);
  return;
}

Assistant:

void CVmObjList::restore_from_file(VMG_ vm_obj_id_t,
                                   CVmFile *fp, CVmObjFixup *fixups)
{
    size_t cnt;

    /* read the element count */
    cnt = fp->read_uint2();

    /* free any existing extension */
    if (ext_ != 0)
    {
        G_mem->get_var_heap()->free_mem(ext_);
        ext_ = 0;
    }

    /* allocate the space */
    alloc_list(vmg_ cnt);

    /* store our element count */
    vmb_put_len(ext_, cnt);

    /* read the contents, if there are any elements */
    fp->read_bytes(ext_ + VMB_LEN, cnt * VMB_DATAHOLDER);

    /* fix object references */
    fixups->fix_dh_array(vmg_ ext_ + VMB_LEN, cnt);
}